

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::section::Type<7,4>::Type<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (Type<7,4> *this,int zaid,double awr,int lat,int lasym,ScatteringLawConstants *constants,
          ScatteringLaw *law,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT)

{
  EffectiveTemperature local_c0;
  
  EffectiveTemperature::
  EffectiveTemperature<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((EffectiveTemperature *)&local_c0,begin,end,lineNumber,MAT,MF,MT);
  Type<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (this,zaid,awr,lat,lasym,constants,law,&local_c0,begin,end,lineNumber,MAT,MF,MT);
  if (local_c0.super_TabulationRecord.yValues.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.super_TabulationRecord.yValues.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.super_TabulationRecord.yValues.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super_TabulationRecord.yValues.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c0.super_TabulationRecord.xValues.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.super_TabulationRecord.xValues.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c0.super_TabulationRecord.xValues.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super_TabulationRecord.xValues.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c0.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_c0.super_TabulationRecord.super_InterpolationBase.
                    interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.super_TabulationRecord.super_InterpolationBase.
                          interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super_TabulationRecord.super_InterpolationBase.
                          interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c0.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_c0.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
                    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_c0.super_TabulationRecord.super_InterpolationBase.
                                   boundaryIndices.super__Vector_base<long,_std::allocator<long>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)local_c0.super_TabulationRecord.super_InterpolationBase.
                                   boundaryIndices.super__Vector_base<long,_std::allocator<long>_>.
                                   _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

Type( int zaid, double awr, int lat, int lasym,
      ScatteringLawConstants&& constants,
      ScatteringLaw&& law,
      Iterator& begin,
      const Iterator& end,
      long& lineNumber,
      int MAT,
      int MF,
      int MT ) :
  Type( zaid, awr, lat, lasym,
        std::move( constants ),
        std::move( law ),
        EffectiveTemperature( begin, end, lineNumber, MAT, MF, MT ),
        begin, end, lineNumber, MAT, MF, MT ) {}